

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

double ipx::PrimalResidual(Model *model,Vector *x)

{
  double dVar1;
  SparseMatrix *pSVar2;
  SparseMatrix *A;
  size_t sVar3;
  double *pdVar4;
  Model *in_RDI;
  double r;
  Int i;
  double res;
  Vector *b;
  SparseMatrix *AIt;
  double local_40;
  double local_38;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  int iVar6;
  double dVar7;
  
  pSVar2 = Model::AIt(in_RDI);
  A = (SparseMatrix *)Model::b(in_RDI);
  dVar7 = 0.0;
  iVar5 = 0;
  while( true ) {
    iVar6 = iVar5;
    sVar3 = std::valarray<double>::size((valarray<double> *)A);
    if ((int)sVar3 <= iVar5) break;
    pdVar4 = std::valarray<double>::operator[]((valarray<double> *)A,(long)iVar6);
    dVar1 = *pdVar4;
    iVar5 = (int)pSVar2;
    local_38 = DotColumn(A,(Int)((ulong)dVar7 >> 0x20),
                         (Vector *)CONCAT44(iVar6,in_stack_ffffffffffffffd0));
    local_38 = dVar1 - local_38;
    std::abs(iVar5);
    pdVar4 = std::max<double>((double *)&stack0xffffffffffffffd8,&local_40);
    dVar7 = *pdVar4;
    iVar5 = iVar6 + 1;
  }
  return dVar7;
}

Assistant:

double PrimalResidual(const Model& model, const Vector& x) {
    const SparseMatrix& AIt = model.AIt();
    const Vector& b = model.b();
    assert((Int)x.size() == AIt.rows());

    double res = 0.0;
    for (Int i = 0; i < (Int)b.size(); i++) {
        double r = b[i] - DotColumn(AIt, i, x);
        res = std::max(res, std::abs(r));
    }
    return res;
}